

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::initiatorFixtureSendMessage_NotLoggedInAndResetOnLogonTrue_MessageNotSentHelper::
~initiatorFixtureSendMessage_NotLoggedInAndResetOnLogonTrue_MessageNotSentHelper
          (initiatorFixtureSendMessage_NotLoggedInAndResetOnLogonTrue_MessageNotSentHelper *this)

{
  initiatorFixtureSendMessage_NotLoggedInAndResetOnLogonTrue_MessageNotSentHelper *this_local;
  
  ~initiatorFixtureSendMessage_NotLoggedInAndResetOnLogonTrue_MessageNotSentHelper(this);
  operator_delete(this,0x630);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, SendMessage_NotLoggedInAndResetOnLogonTrue_MessageNotSent) {
  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );

  createSession(1, 0, 31);

  object->setResetOnLogon(true);

  FIX::Message neworder1 = createNewOrderSingle("ISLD", "TW", 1);
  CHECK(!object->send(neworder1));
}